

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

FaceData * __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
get(PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*> *this,
   ReductionKey *key)

{
  uint32_t uVar1;
  bool bVar2;
  Entry *pEVar3;
  Entry *this_00;
  ReductionKey *in_RSI;
  PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*> *in_RDI;
  Entry *e;
  uint32_t i;
  FaceData *result;
  uint32_t hash;
  Entry *entries;
  uint32_t mask;
  uint local_34;
  
  uVar1 = in_RDI->_numEntries;
  pEVar3 = getEntries(in_RDI);
  local_34 = PtexReader::ReductionKey::hash(in_RSI);
  while( true ) {
    this_00 = pEVar3 + (local_34 & uVar1 - 1);
    bVar2 = PtexReader::ReductionKey::matches(&this_00->key,in_RSI);
    if (bVar2) {
      return this_00->value;
    }
    if (this_00->value == (FaceData *)0x0) break;
    local_34 = local_34 + 1;
  }
  return (FaceData *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }